

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_wal_autocheckpoint(sqlite3 *db,int nFrame)

{
  int nFrame_local;
  sqlite3 *db_local;
  
  if (nFrame < 1) {
    sqlite3_wal_hook(db,(_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0,(void *)0x0);
  }
  else {
    sqlite3_wal_hook(db,sqlite3WalDefaultHook,(void *)(long)nFrame);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_wal_autocheckpoint(sqlite3 *db, int nFrame){
#ifdef SQLITE_OMIT_WAL
  UNUSED_PARAMETER(db);
  UNUSED_PARAMETER(nFrame);
#else
  if( nFrame>0 ){
    sqlite3_wal_hook(db, sqlite3WalDefaultHook, SQLITE_INT_TO_PTR(nFrame));
  }else{
    sqlite3_wal_hook(db, 0, 0);
  }
#endif
  return SQLITE_OK;
}